

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

void __thiscall cmELF::~cmELF(cmELF *this)

{
  cmELF *this_local;
  
  std::__cxx11::string::~string((string *)&this->ErrorMessage);
  std::unique_ptr<cmELFInternal,_std::default_delete<cmELFInternal>_>::~unique_ptr(&this->Internal);
  return;
}

Assistant:

cmELF::~cmELF() = default;